

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_audio.cpp
# Opt level: O2

void __thiscall cubeb_run_volume_test_float_Test::TestBody(cubeb_run_volume_test_float_Test *this)

{
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  AssertionResult gtest_ar;
  
  local_30.ptr_._0_4_ = run_volume_test(1);
  local_28.data_._0_4_ = 0;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (&gtest_ar.success_,"run_volume_test(1)",(int *)&local_30,(anon_enum_32 *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_audio.cpp"
               ,0xd8,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(cubeb, run_volume_test_float)
{
  ASSERT_EQ(run_volume_test(1), CUBEB_OK);
}